

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_Versioning.h
# Opt level: O2

void __thiscall Test_Versioning::~Test_Versioning(Test_Versioning *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x10);
  return;
}

Assistant:

Q_OBJECT
private slots:
   void TestPrefixSameVersion()
   {
      bool needsUpgrade;
      needsUpgrade = QSimpleUpdater::compareVersions("0.0.1", "0.0.1");
      QVERIFY(!needsUpgrade);
      needsUpgrade = QSimpleUpdater::compareVersions("0.0.1", "v0.0.1");
      QVERIFY(!needsUpgrade);
      needsUpgrade = QSimpleUpdater::compareVersions("v0.0.1", "0.0.1");
      QVERIFY(!needsUpgrade);
      needsUpgrade = QSimpleUpdater::compareVersions("v0.0.1", "v0.0.1");
      QVERIFY(!needsUpgrade);
   }